

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intra_mode_search_utils.h
# Opt level: O0

void generate_hog_using_gradient_cache
               (MACROBLOCK *x,int rows,int cols,BLOCK_SIZE sb_size,PLANE_TYPE plane,float *hist)

{
  char cVar1;
  ushort uVar2;
  int iVar3;
  long lVar4;
  byte in_CL;
  byte bVar5;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  byte in_R8B;
  float *in_R9;
  int8_t idx;
  _Bool is_dx_zero;
  uint16_t abs_dx_abs_dy_sum;
  int c;
  int r;
  PixelLevelGradientInfo *grad_info_blk;
  int block_offset_in_grad_cache;
  int mi_col_in_sb;
  int mi_row_in_sb;
  int sb_width;
  int ss_y;
  int ss_x;
  float total;
  int local_50;
  int local_4c;
  float local_24;
  
  local_24 = 0.1;
  bVar5 = (byte)*(undefined4 *)(in_RDI + (ulong)in_R8B * 0xa30 + 0x1b4);
  iVar3 = (int)(uint)block_size_wide[in_CL] >> (bVar5 & 0x1f);
  lVar4 = *(long *)(in_RDI + 0x1f6b8) + (long)(int)((uint)in_R8B << 0xe) * 4 +
          (long)(int)(iVar3 * ((*(uint *)(in_RDI + 0x1a0) &
                               "\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                               [in_CL] - 1) <<
                              (2U - (char)*(undefined4 *)(in_RDI + (ulong)in_R8B * 0xa30 + 0x1b8) &
                              0x1f)) +
                     ((*(uint *)(in_RDI + 0x1a4) &
                      "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                      [in_CL] - 1) << (2 - bVar5 & 0x1f))) * 4;
  for (local_4c = 1; local_4c < in_ESI + -1; local_4c = local_4c + 1) {
    for (local_50 = 1; local_50 < in_EDX + -1; local_50 = local_50 + 1) {
      uVar2 = *(ushort *)(lVar4 + (long)(local_4c * iVar3 + local_50) * 4);
      if (uVar2 != 0) {
        local_24 = (float)uVar2 + local_24;
        if ((*(byte *)(lVar4 + 3 + (long)(local_4c * iVar3 + local_50) * 4) & 1) == 0) {
          cVar1 = *(char *)(lVar4 + 2 + (long)(local_4c * iVar3 + local_50) * 4);
          in_R9[cVar1] = (float)uVar2 + in_R9[cVar1];
        }
        else {
          *in_R9 = (float)((int)(uint)uVar2 >> 1) + *in_R9;
          in_R9[0x1f] = (float)((int)(uint)uVar2 >> 1) + in_R9[0x1f];
        }
      }
    }
  }
  normalize_hog(local_24,in_R9);
  return;
}

Assistant:

static inline void generate_hog_using_gradient_cache(const MACROBLOCK *x,
                                                     int rows, int cols,
                                                     BLOCK_SIZE sb_size,
                                                     PLANE_TYPE plane,
                                                     float *hist) {
  float total = 0.1f;
  const int ss_x = x->e_mbd.plane[plane].subsampling_x;
  const int ss_y = x->e_mbd.plane[plane].subsampling_y;
  const int sb_width = block_size_wide[sb_size] >> ss_x;

  // Derive the offset from the starting of the superblock in order to locate
  // the block level gradient data in the cache.
  const int mi_row_in_sb = x->e_mbd.mi_row & (mi_size_high[sb_size] - 1);
  const int mi_col_in_sb = x->e_mbd.mi_col & (mi_size_wide[sb_size] - 1);
  const int block_offset_in_grad_cache =
      sb_width * (mi_row_in_sb << (MI_SIZE_LOG2 - ss_y)) +
      (mi_col_in_sb << (MI_SIZE_LOG2 - ss_x));
  const PixelLevelGradientInfo *grad_info_blk = x->pixel_gradient_info +
                                                plane * MAX_SB_SQUARE +
                                                block_offset_in_grad_cache;

  // Retrieve the cached gradient information and generate the histogram.
  for (int r = 1; r < rows - 1; ++r) {
    for (int c = 1; c < cols - 1; ++c) {
      const uint16_t abs_dx_abs_dy_sum =
          grad_info_blk[r * sb_width + c].abs_dx_abs_dy_sum;
      if (!abs_dx_abs_dy_sum) continue;
      total += abs_dx_abs_dy_sum;
      const bool is_dx_zero = grad_info_blk[r * sb_width + c].is_dx_zero;
      if (is_dx_zero) {
        hist[0] += abs_dx_abs_dy_sum >> 1;
        hist[BINS - 1] += abs_dx_abs_dy_sum >> 1;
      } else {
        const int8_t idx = grad_info_blk[r * sb_width + c].hist_bin_idx;
        assert(idx >= 0 && idx < BINS);
        hist[idx] += abs_dx_abs_dy_sum;
      }
    }
  }
  normalize_hog(total, hist);
}